

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int g_iofile(lua_State *L,int f,char *mode)

{
  TValue *pTVar1;
  StkId pTVar2;
  int extraout_EAX;
  char *__filename;
  GCObject *pGVar3;
  char *filename;
  TValue *pTVar4;
  
  pTVar1 = L->base;
  pTVar4 = &luaO_nilobject_;
  if (((pTVar1 == &luaO_nilobject_) || (L->top <= pTVar1)) || (pTVar1->tt < 1)) goto LAB_001114e8;
  __filename = lua_tolstring(L,1,(size_t *)0x0);
  if (__filename == (char *)0x0) {
LAB_001114af:
    tofile(L);
    pTVar2 = L->top;
    if (L->base < pTVar2) {
      pTVar4 = L->base;
    }
    pTVar2->value = pTVar4->value;
    pTVar2->tt = pTVar4->tt;
    L->top = L->top + 1;
  }
  else {
    pTVar4 = (TValue *)newfile(L);
    pGVar3 = (GCObject *)fopen(__filename,mode);
    (pTVar4->value).gc = pGVar3;
    if (pGVar3 == (GCObject *)0x0) {
      fileerror(L,(int)__filename,filename);
      goto LAB_001114af;
    }
  }
  lua_rawseti(L,-0x2711,f);
LAB_001114e8:
  lua_rawgeti(L,-0x2711,f);
  return extraout_EAX;
}

Assistant:

static int g_iofile(lua_State*L,int f,const char*mode){
if(!lua_isnoneornil(L,1)){
const char*filename=lua_tostring(L,1);
if(filename){
FILE**pf=newfile(L);
*pf=fopen(filename,mode);
if(*pf==NULL)
fileerror(L,1,filename);
}
else{
tofile(L);
lua_pushvalue(L,1);
}
lua_rawseti(L,(-10001),f);
}
lua_rawgeti(L,(-10001),f);
return 1;
}